

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

TraceFormat cmake::StringToTraceFormat(string *traceStr)

{
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_>
  __l;
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  TraceFormat local_11c;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>
  *local_f0;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_>_>_>
  local_e0;
  string *local_d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>
  *local_d0;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_>_>_>
  local_c8;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_>_>_>
  local_c0;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_>_>_>
  it;
  string traceStrLowCase;
  TraceFormat local_90 [5];
  TraceFormat local_7c;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>
  *local_78;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>
  local_70;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>
  local_48;
  iterator local_20;
  size_type local_18;
  undefined1 local_10 [8];
  string *traceStr_local;
  
  local_10 = (undefined1  [8])traceStr;
  if (StringToTraceFormat(std::__cxx11::string_const&)::levels_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&StringToTraceFormat(std::__cxx11::string_const&)::levels_abi_cxx11_
                               );
    if (iVar2 != 0) {
      local_78 = &local_70;
      local_7c = TRACE_HUMAN;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>
      ::pair<const_char_(&)[6],_cmake::TraceFormat,_true>(local_78,(char (*) [6])"human",&local_7c);
      local_78 = &local_48;
      local_90[0] = TRACE_JSON_V1;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>
      ::pair<const_char_(&)[8],_cmake::TraceFormat,_true>(local_78,(char (*) [8])"json-v1",local_90)
      ;
      local_20 = &local_70;
      local_18 = 2;
      std::
      allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_>
      ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_>
                   *)(traceStrLowCase.field_2._M_local_buf + 0xf));
      __l._M_len = local_18;
      __l._M_array = local_20;
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_>_>
      ::vector(&StringToTraceFormat(std::__cxx11::string_const&)::levels_abi_cxx11_,__l,
               (allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_>
                *)(traceStrLowCase.field_2._M_local_buf + 0xf));
      std::
      allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_>
      ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_>
                    *)(traceStrLowCase.field_2._M_local_buf + 0xf));
      local_f0 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>
                  *)&local_20;
      do {
        local_f0 = local_f0 + -1;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>
        ::~pair(local_f0);
      } while (local_f0 != &local_70);
      __cxa_atexit(std::
                   vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_>_>
                   ::~vector,&StringToTraceFormat(std::__cxx11::string_const&)::levels_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&StringToTraceFormat(std::__cxx11::string_const&)::levels_abi_cxx11_);
    }
  }
  cmsys::SystemTools::LowerCase((string *)&it,(string *)local_10);
  local_c8._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>
        *)std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_>_>
          ::cbegin(&StringToTraceFormat(std::__cxx11::string_const&)::levels_abi_cxx11_);
  local_d0 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>
              *)std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_>_>
                ::cend(&StringToTraceFormat(std::__cxx11::string_const&)::levels_abi_cxx11_);
  local_d8 = (string *)&it;
  local_c0 = std::
             find_if<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,cmake::TraceFormat>const*,std::vector<std::pair<std::__cxx11::string,cmake::TraceFormat>,std::allocator<std::pair<std::__cxx11::string,cmake::TraceFormat>>>>,cmake::StringToTraceFormat(std::__cxx11::string_const&)::__0>
                       (local_c8,(__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_>_>_>
                                  )local_d0,(string *)&it);
  local_e0._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>
        *)std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_>_>
          ::cend(&StringToTraceFormat(std::__cxx11::string_const&)::levels_abi_cxx11_);
  bVar1 = __gnu_cxx::operator!=(&local_c0,&local_e0);
  if (bVar1) {
    ppVar3 = __gnu_cxx::
             __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::TraceFormat>_>_>_>
             ::operator->(&local_c0);
    local_11c = ppVar3->second;
  }
  else {
    local_11c = TRACE_UNDEFINED;
  }
  std::__cxx11::string::~string((string *)&it);
  return local_11c;
}

Assistant:

cmake::TraceFormat cmake::StringToTraceFormat(const std::string& traceStr)
{
  using TracePair = std::pair<std::string, TraceFormat>;
  static const std::vector<TracePair> levels = {
    { "human", TraceFormat::TRACE_HUMAN },
    { "json-v1", TraceFormat::TRACE_JSON_V1 },
  };

  const auto traceStrLowCase = cmSystemTools::LowerCase(traceStr);

  const auto it = std::find_if(levels.cbegin(), levels.cend(),
                               [&traceStrLowCase](const TracePair& p) {
                                 return p.first == traceStrLowCase;
                               });
  return (it != levels.cend()) ? it->second : TraceFormat::TRACE_UNDEFINED;
}